

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

void glob_cleanup(URLGlob *glob)

{
  ulong uVar1;
  ulong uVar2;
  
  if (glob != (URLGlob *)0x0) {
    for (uVar2 = 0; uVar2 < glob->size; uVar2 = uVar2 + 1) {
      if ((glob->pattern[uVar2].type == UPTSet) &&
         (glob->pattern[uVar2].content.Set.elements != (char **)0x0)) {
        for (uVar1 = (ulong)(uint)glob->pattern[uVar2].content.Set.size; 0 < (int)uVar1;
            uVar1 = uVar1 - 1) {
          free(*(void **)((glob->pattern[uVar2].content.NumRange.min_n - 8) + uVar1 * 8));
          *(undefined8 *)((glob->pattern[uVar2].content.NumRange.min_n - 8) + uVar1 * 8) = 0;
        }
        free(glob->pattern[uVar2].content.Set.elements);
        glob->pattern[uVar2].content.Set.elements = (char **)0x0;
      }
    }
    free(glob->glob_buffer);
    free(glob);
    return;
  }
  return;
}

Assistant:

void glob_cleanup(struct URLGlob *glob)
{
  size_t i;
  int elem;

  if(!glob)
    return;

  for(i = 0; i < glob->size; i++) {
    if((glob->pattern[i].type == UPTSet) &&
       (glob->pattern[i].content.Set.elements)) {
      for(elem = glob->pattern[i].content.Set.size - 1;
          elem >= 0;
          --elem) {
        Curl_safefree(glob->pattern[i].content.Set.elements[elem]);
      }
      Curl_safefree(glob->pattern[i].content.Set.elements);
    }
  }
  Curl_safefree(glob->glob_buffer);
  Curl_safefree(glob);
}